

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O1

int gost_ec_compute_public(EC_KEY *ec)

{
  int iVar1;
  EC_GROUP *group;
  BN_CTX *ctx;
  BIGNUM *n;
  EC_POINT *r;
  int iVar2;
  
  if (ec == (EC_KEY *)0x0) {
    group = (EC_GROUP *)0x0;
  }
  else {
    group = EC_KEY_get0_group((EC_KEY *)ec);
  }
  if (group == (EC_GROUP *)0x0) {
    iVar2 = 0x77;
    iVar1 = 0x1ca;
LAB_00125029:
    ERR_GOST_error(0x6b,iVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_sign.c"
                   ,iVar1);
    return 0;
  }
  ctx = (BN_CTX *)BN_CTX_secure_new();
  if (ctx == (BN_CTX *)0x0) {
    iVar2 = 0xc0100;
    iVar1 = 0x1d0;
    goto LAB_00125029;
  }
  BN_CTX_start(ctx);
  n = EC_KEY_get0_private_key((EC_KEY *)ec);
  if (n == (BIGNUM *)0x0) {
    iVar2 = 0x80010;
    iVar1 = 0x1d7;
LAB_00125061:
    ERR_GOST_error(0x6b,iVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_sign.c"
                   ,iVar1);
    r = (EC_POINT *)0x0;
  }
  else {
    r = EC_POINT_new(group);
    if (r == (EC_POINT *)0x0) {
      iVar2 = 0xc0100;
      iVar1 = 0x1dd;
      goto LAB_00125061;
    }
    iVar2 = 0;
    iVar1 = gost_ec_point_mul((EC_GROUP *)group,(EC_POINT *)r,(BIGNUM *)n,(EC_POINT *)0x0,
                              (BIGNUM *)0x0,(BN_CTX *)ctx);
    if (iVar1 == 0) {
      ERR_GOST_error(0x6b,0x80010,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_sign.c"
                     ,0x1e2);
      goto LAB_0012506c;
    }
    iVar1 = EC_KEY_set_public_key((EC_KEY *)ec,r);
    iVar2 = 1;
    if (iVar1 != 0) goto LAB_0012506c;
    ERR_GOST_error(0x6b,0x80010,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_sign.c"
                   ,0x1e6);
  }
  iVar2 = 0;
LAB_0012506c:
  if (r != (EC_POINT *)0x0) {
    EC_POINT_free(r);
  }
  BN_CTX_end(ctx);
  BN_CTX_free(ctx);
  return iVar2;
}

Assistant:

int gost_ec_compute_public(EC_KEY *ec)
{
    const EC_GROUP *group = (ec) ? EC_KEY_get0_group(ec) : NULL;
    EC_POINT *pub_key = NULL;
    const BIGNUM *priv_key = NULL;
    BN_CTX *ctx = NULL;
    int ok = 0;

    if (!group) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, GOST_R_KEY_IS_NOT_INITIALIZED);
        return 0;
    }

    ctx = BN_CTX_secure_new();
    if (!ctx) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    BN_CTX_start(ctx);
    priv_key = EC_KEY_get0_private_key(ec);
    if (!priv_key) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_EC_LIB);
        goto err;
    }

    pub_key = EC_POINT_new(group);
    if (!pub_key) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (!gost_ec_point_mul(group, pub_key, priv_key, NULL, NULL, ctx)) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_EC_LIB);
        goto err;
    }
    if (!EC_KEY_set_public_key(ec, pub_key)) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_EC_LIB);
        goto err;
    }
    ok = 1;
 err:
    if (pub_key)
        EC_POINT_free(pub_key);
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    return ok;
}